

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O1

string * getCommonCodeGen<std::__cxx11::string>
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *vals,vector<int,_std::allocator<int>_> *mapping,size_t n,string *map_name,
                   bool nonKeyLookups)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppuVar2;
  pointer pbVar3;
  int *piVar4;
  unsigned_long *__val;
  ulong __val_00;
  bool bVar5;
  long lVar6;
  _Alloc_hider _Var7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_00;
  char cVar8;
  int iVar9;
  long *plVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  long *plVar13;
  unsigned_long **ppuVar14;
  ulong *puVar15;
  pointer pcVar16;
  unsigned_long *puVar17;
  size_t sVar18;
  ulong uVar19;
  undefined8 uVar20;
  char cVar21;
  string *val;
  size_type sVar22;
  pointer pbVar23;
  ulong uVar24;
  int *val_2;
  int *piVar25;
  string *val_1;
  pointer pcVar26;
  string __str;
  vector<unsigned_long,_std::allocator<unsigned_long>_> start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sze;
  vector<int,_std::allocator<int>_> *__range1_1;
  string upper_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  size_t num_chars;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  size_t local_120;
  unsigned_long **local_118;
  iterator iStack_110;
  unsigned_long *local_108;
  long lStack_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  long lStack_e0;
  vector<int,_std::allocator<int>_> *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  undefined7 *local_70;
  undefined8 local_68;
  undefined7 local_60;
  undefined4 uStack_59;
  undefined1 local_55;
  undefined7 *local_50;
  undefined8 local_48;
  undefined7 local_40;
  undefined4 uStack_39;
  undefined1 local_35;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar26 = (map_name->_M_dataplus)._M_p;
  local_120 = n;
  local_d0 = mapping;
  local_a8 = vals;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar26,pcVar26 + map_name->_M_string_length);
  _Var7._M_p = local_c8._M_dataplus._M_p;
  if (local_c8._M_string_length != 0) {
    sVar22 = 0;
    do {
      iVar9 = toupper((int)_Var7._M_p[sVar22]);
      _Var7._M_p[sVar22] = (char)iVar9;
      sVar22 = sVar22 + 1;
    } while (local_c8._M_string_length != sVar22);
  }
  std::operator+(&local_140,"//CODEGEN FILE\n#ifndef POIFECT_",&local_c8);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = plVar10[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_160._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_160,(ulong)local_c8._M_dataplus._M_p);
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_170 = *plVar13;
    lStack_168 = plVar10[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar13;
    local_180 = (long *)*plVar10;
  }
  local_178 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar12) {
    lVar6 = plVar10[3];
    local_80->_M_allocated_capacity = *psVar12;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar10;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
  }
  __return_storage_ptr__->_M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::operator+(&local_a0,"class ",map_name);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_118 = &local_108;
  ppuVar14 = (unsigned_long **)(plVar10 + 2);
  if ((unsigned_long **)*plVar10 == ppuVar14) {
    local_108 = *ppuVar14;
    lStack_100 = plVar10[3];
  }
  else {
    local_108 = *ppuVar14;
    local_118 = (unsigned_long **)*plVar10;
  }
  iStack_110._M_current = (unsigned_long *)plVar10[1];
  *plVar10 = (long)ppuVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_40 = 0x74733a3a647473;
  uStack_39 = 0x676e6972;
  local_48 = 0xb;
  local_35 = 0;
  local_78 = keys;
  local_50 = &local_40;
  std::__cxx11::string::compare((char *)&local_50);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
  ppuVar2 = &local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar13 = plVar10 + 2;
  if ((pointer *)*plVar10 == (pointer *)plVar13) {
    local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
    lStack_e0 = plVar10[3];
    local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar2;
  }
  else {
    local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
    local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar10;
  }
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_f8);
  paVar1 = &local_140.field_2;
  puVar15 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_140.field_2._M_allocated_capacity = *puVar15;
    local_140.field_2._8_8_ = plVar10[3];
    local_140._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_140.field_2._M_allocated_capacity = *puVar15;
    local_140._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_140._M_string_length = plVar10[1];
  *plVar10 = (long)puVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_60 = 0x74733a3a647473;
  uStack_59 = 0x676e6972;
  local_68 = 0xb;
  local_55 = 0;
  uVar20 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    uVar20 = local_140.field_2._M_allocated_capacity;
  }
  local_70 = &local_60;
  if ((local_140._M_string_length + 0xb < 0x10) &&
     ((ulong)uVar20 < local_140._M_string_length + 0xb)) {
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_70,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
  }
  else {
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)&local_60);
  }
  psVar12 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = puVar11[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_160._M_string_length = puVar11[1];
  *puVar11 = psVar12;
  puVar11[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_180 = &local_170;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_170 = *plVar13;
    lStack_168 = plVar10[3];
  }
  else {
    local_170 = *plVar13;
    local_180 = (long *)*plVar10;
  }
  local_178 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT17((undefined1)uStack_59,local_60) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  keys_00 = local_78;
  if ((pointer *)
      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar2) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT17((undefined1)uStack_39,local_40) + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,(long)local_108 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  writeKeys(__return_storage_ptr__,keys_00,local_d0,local_120);
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_a0._M_dataplus._M_p = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_108 = (unsigned_long *)0x0;
  local_118 = (unsigned_long **)0x0;
  iStack_110._M_current = (unsigned_long *)0x0;
  pbVar23 = (local_a8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (local_a8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar23 != pbVar3) {
    do {
      if (iStack_110._M_current == local_108) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_118,iStack_110,
                   (unsigned_long *)&local_a0);
      }
      else {
        *iStack_110._M_current = (unsigned_long)local_a0._M_dataplus._M_p;
        iStack_110._M_current = iStack_110._M_current + 1;
      }
      local_180 = (long *)pbVar23->_M_string_length;
      local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p + (long)local_180;
      if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_180);
      }
      else {
        *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)local_180;
        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 != pbVar3);
  }
  pcVar26 = local_a0._M_dataplus._M_p + 1;
  cVar21 = '\x01';
  paVar1 = &local_160.field_2;
  if ((pointer)0x9 < pcVar26) {
    pcVar16 = pcVar26;
    cVar8 = '\x04';
    do {
      cVar21 = cVar8;
      if (pcVar16 < (pointer)0x64) {
        cVar21 = cVar21 + -2;
        goto LAB_00110d91;
      }
      if (pcVar16 < (pointer)0x3e8) {
        cVar21 = cVar21 + -1;
        goto LAB_00110d91;
      }
      if (pcVar16 < (pointer)0x2710) goto LAB_00110d91;
      bVar5 = (pointer)0x1869f < pcVar16;
      pcVar16 = (pointer)((ulong)pcVar16 / 10000);
      cVar8 = cVar21 + '\x04';
    } while (bVar5);
    cVar21 = cVar21 + '\x01';
  }
LAB_00110d91:
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_140,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,(unsigned_long)pcVar26);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x11744f);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = plVar10[3];
    local_160._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_160._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_170 = *plVar13;
    lStack_168 = plVar10[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar13;
    local_180 = (long *)*plVar10;
  }
  local_178 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  pbVar23 = (local_a8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (local_a8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar23 != pbVar3) {
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      cVar21 = '\b';
      do {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        cVar21 = cVar21 + -1;
      } while (cVar21 != '\0');
      std::operator+(&local_160,'\"',pbVar23);
      plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_160,local_160._M_string_length,0,'\x01');
      local_180 = &local_170;
      plVar13 = plVar10 + 2;
      if ((long *)*plVar10 == plVar13) {
        local_170 = *plVar13;
        lStack_168 = plVar10[3];
      }
      else {
        local_170 = *plVar13;
        local_180 = (long *)*plVar10;
      }
      local_178 = plVar10[1];
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != paVar1) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 != pbVar3);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_120 = local_120 + 1;
  cVar21 = '\x01';
  if (9 < local_120) {
    uVar24 = local_120;
    cVar8 = '\x04';
    do {
      cVar21 = cVar8;
      if (uVar24 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_00111044;
      }
      if (uVar24 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_00111044;
      }
      if (uVar24 < 10000) goto LAB_00111044;
      bVar5 = 99999 < uVar24;
      uVar24 = uVar24 / 10000;
      cVar8 = cVar21 + '\x04';
    } while (bVar5);
    cVar21 = cVar21 + '\x01';
  }
LAB_00111044:
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_140,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,local_120);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x1160d6);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = plVar10[3];
    local_160._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_160._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_170 = *plVar13;
    lStack_168 = plVar10[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar13;
    local_180 = (long *)*plVar10;
  }
  local_178 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  piVar25 = (local_d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar4 = (local_d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar25 != piVar4) {
    uVar24 = 0;
    do {
      if ((uVar24 != 0) && (uVar24 == (uVar24 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (*piVar25 == -1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        __val = local_118[*piVar25];
        cVar21 = '\x01';
        if ((unsigned_long *)0x9 < __val) {
          puVar17 = __val;
          cVar8 = '\x04';
          do {
            cVar21 = cVar8;
            if (puVar17 < (unsigned_long *)0x64) {
              cVar21 = cVar21 + -2;
              goto LAB_00111254;
            }
            if (puVar17 < (unsigned_long *)0x3e8) {
              cVar21 = cVar21 + -1;
              goto LAB_00111254;
            }
            if (puVar17 < (unsigned_long *)0x2710) goto LAB_00111254;
            bVar5 = (unsigned_long *)0x1869f < puVar17;
            puVar17 = (unsigned_long *)((ulong)puVar17 / 10000);
            cVar8 = cVar21 + '\x04';
          } while (bVar5);
          cVar21 = cVar21 + '\x01';
        }
LAB_00111254:
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_160,cVar21);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_160._M_dataplus._M_p,(uint)local_160._M_string_length,(unsigned_long)__val)
        ;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_180 = &local_170;
        plVar13 = plVar10 + 2;
        if ((long *)*plVar10 == plVar13) {
          local_170 = *plVar13;
          lStack_168 = plVar10[3];
        }
        else {
          local_170 = *plVar13;
          local_180 = (long *)*plVar10;
        }
        local_178 = plVar10[1];
        *plVar10 = (long)plVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      uVar24 = uVar24 + 1;
      piVar25 = piVar25 + 1;
    } while (piVar25 != piVar4);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar21 = '\x01';
  if (9 < local_120) {
    sVar18 = local_120;
    cVar8 = '\x04';
    do {
      cVar21 = cVar8;
      if (sVar18 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_001113a1;
      }
      if (sVar18 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_001113a1;
      }
      if (sVar18 < 10000) goto LAB_001113a1;
      bVar5 = 99999 < sVar18;
      sVar18 = sVar18 / 10000;
      cVar8 = cVar21 + '\x04';
    } while (bVar5);
    cVar21 = cVar21 + '\x01';
  }
LAB_001113a1:
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_140,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_140._M_dataplus._M_p,(uint)local_140._M_string_length,local_120);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x1160d6);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = plVar10[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_160._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_170 = *plVar13;
    lStack_168 = plVar10[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *plVar13;
    local_180 = (long *)*plVar10;
  }
  local_178 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  piVar25 = (local_d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar4 = (local_d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (piVar25 != piVar4) {
    uVar24 = 0;
    do {
      if ((uVar24 != 0) && (uVar24 == (uVar24 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (*piVar25 == -1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        __val_00 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar25];
        cVar21 = '\x01';
        if (9 < __val_00) {
          uVar19 = __val_00;
          cVar8 = '\x04';
          do {
            cVar21 = cVar8;
            if (uVar19 < 100) {
              cVar21 = cVar21 + -2;
              goto LAB_001115ad;
            }
            if (uVar19 < 1000) {
              cVar21 = cVar21 + -1;
              goto LAB_001115ad;
            }
            if (uVar19 < 10000) goto LAB_001115ad;
            bVar5 = 99999 < uVar19;
            uVar19 = uVar19 / 10000;
            cVar8 = cVar21 + '\x04';
          } while (bVar5);
          cVar21 = cVar21 + '\x01';
        }
LAB_001115ad:
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_160,cVar21);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_160._M_dataplus._M_p,(uint)local_160._M_string_length,__val_00);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
        plVar13 = plVar10 + 2;
        if ((long *)*plVar10 == plVar13) {
          local_170 = *plVar13;
          lStack_168 = plVar10[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar13;
          local_180 = (long *)*plVar10;
        }
        local_178 = plVar10[1];
        *plVar10 = (long)plVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_180);
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      uVar24 = uVar24 + 1;
      piVar25 = piVar25 + 1;
    } while (piVar25 != piVar4);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_118 != (unsigned_long **)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getCommonCodeGen(const std::vector<KeyType>& keys,
                             const std::vector<std::string> vals,
                             const std::vector<int>& mapping,
                             size_t n,
                             std::string map_name,
                             bool nonKeyLookups){
    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);

    std::string str = "//CODEGEN FILE\n"
                      "#ifndef POIFECT_" + upper_name + "_H\n"
                      "#define POIFECT_" + upper_name + "_H\n"
                      "#include <array>\n";

    if(!nonKeyLookups) str += "#include <cassert>\n";

    str += "#include <limits>\n"
           "#include <string>\n\n";

    str += "class " + map_name + " final{\n"
    "public:\n"
    "    static " + (typeStr(keys[0])!="std::string" ? "constexpr " : "")
            + "std::string_view lookup(const " + typeStr(keys[0]) + "& key) noexcept;\n"
    "\n"
    "private:\n";

    if(!nonKeyLookups) str += "    #ifndef NDEBUG\n";
    writeKeys(str, keys, mapping, n);
    if(!nonKeyLookups) str += "    #endif\n";
    str += "\n";

    size_t num_chars = 0;
    std::vector<size_t> sze;
    std::vector<size_t> start;

    for(const std::string& val : vals){
        start.push_back(num_chars);
        num_chars += val.size();
        sze.push_back(val.size());
    }

    str += "    static constexpr char flat_vals[" + std::to_string(num_chars+1) + "] = ";
    for(const std::string& val : vals){
        str.push_back('\n');
        for(uint8_t i = 0; i < 8; i++) str.push_back(' ');
        str += '"' + val + '"';
    }
    str += ";\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> val_start {\n        ";
    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(start[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> val_size {\n        ";
    i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(sze[val]) + ",";
    }
    str += "\n    };\n\n";

    return str;
}